

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateArenaDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  pointer ppFVar2;
  bool bVar3;
  FileOptions_OptimizeMode FVar4;
  int iVar5;
  FieldGenerator *pFVar6;
  char *format_00;
  bool bVar7;
  pointer ppFVar8;
  Iterator __begin4;
  Iterator __begin3;
  Iterator __end4;
  Formatter format;
  Iterator __end3;
  Iterator local_b0;
  Iterator local_a0;
  FieldGeneratorMap *local_90;
  Iterator local_88;
  Formatter local_78;
  Iterator local_40;
  
  pDVar1 = this->descriptor_;
  FVar4 = GetOptimizeFor(*(FileDescriptor **)(pDVar1 + 0x10),&this->options_,(bool *)0x0);
  if (((FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar1 + 0x78) != 0)) ||
     (*(int *)(pDVar1 + 4) != 0)) {
    local_78.printer_ = printer;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_78.vars_._M_t,&(this->variables_)._M_t);
    Formatter::operator()<>(&local_78,"void $classname$::ArenaDtor(void* object) {\n");
    io::Printer::Indent(local_78.printer_);
    Formatter::operator()<>
              (&local_78,
               "$classname$* _this = reinterpret_cast< $classname$* >(object);\n(void)_this;\n");
    ppFVar8 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar2 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar8 == ppFVar2) {
      bVar7 = false;
    }
    else {
      local_90 = &this->field_generators_;
      bVar3 = false;
      do {
        pFVar6 = FieldGeneratorMap::get(local_90,*ppFVar8);
        iVar5 = (*pFVar6->_vptr_FieldGenerator[0x11])(pFVar6,printer);
        bVar7 = true;
        if ((char)iVar5 == '\0') {
          bVar7 = bVar3;
        }
        ppFVar8 = ppFVar8 + 1;
        bVar3 = bVar7;
      } while (ppFVar8 != ppFVar2);
    }
    local_a0.descriptor = this->descriptor_;
    local_a0.idx = 0;
    local_40.idx = *(int *)(local_a0.descriptor + 0x6c);
    local_40.descriptor = local_a0.descriptor;
    while (bVar3 = operator==(&local_a0,&local_40), !bVar3) {
      local_b0.descriptor =
           (OneofDescriptor *)(*(long *)(local_a0.descriptor + 0x30) + (long)local_a0.idx * 0x28);
      local_b0.idx = 0;
      local_88.idx = *(int *)(local_b0.descriptor + 4);
      local_88.descriptor = local_b0.descriptor;
      while (bVar3 = operator==(&local_b0,&local_88), !bVar3) {
        pFVar6 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)
                            ((long)local_b0.idx * 0x48 + *(long *)(local_b0.descriptor + 0x20)));
        iVar5 = (*pFVar6->_vptr_FieldGenerator[0x11])(pFVar6,printer);
        bVar3 = true;
        if ((char)iVar5 == '\0') {
          bVar3 = bVar7;
        }
        bVar7 = bVar3;
        local_b0.idx = local_b0.idx + 1;
      }
      local_a0.idx = local_a0.idx + 1;
    }
    io::Printer::Outdent(local_78.printer_);
    Formatter::operator()<>(&local_78,"}\n");
    format_00 = "void $classname$::RegisterArenaDtor(::$proto_ns$::Arena*) {\n}\n";
    if (bVar7) {
      format_00 = 
      "inline void $classname$::RegisterArenaDtor(::$proto_ns$::Arena* arena) {\n  if (arena != nullptr) {\n    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n  }\n}\n"
      ;
    }
    Formatter::operator()<>(&local_78,format_00);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_78.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateArenaDestructorCode(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  // Generate the ArenaDtor() method. Track whether any fields actually produced
  // code that needs to be called.
  format("void $classname$::ArenaDtor(void* object) {\n");
  format.Indent();

  // This code is placed inside a static method, rather than an ordinary one,
  // since that simplifies Arena's destructor list (ordinary function pointers
  // rather than member function pointers). _this is the object being
  // destructed.
  format(
      "$classname$* _this = reinterpret_cast< $classname$* >(object);\n"
      // avoid an "unused variable" warning in case no fields have dtor code.
      "(void)_this;\n");

  bool need_registration = false;
  // Process non-oneof fields first.
  for (auto field : optimized_order_) {
    if (field_generators_.get(field).GenerateArenaDestructorCode(printer)) {
      need_registration = true;
    }
  }

  // Process oneof fields.
  //
  // Note:  As of 10/5/2016, GenerateArenaDestructorCode does not emit anything
  // and returns false for oneof fields.
  for (auto oneof : OneOfRange(descriptor_)) {
    for (auto field : FieldRange(oneof)) {
      if (!IsFieldStripped(field, options_) &&
          field_generators_.get(field).GenerateArenaDestructorCode(printer)) {
        need_registration = true;
      }
    }
  }

  format.Outdent();
  format("}\n");

  if (need_registration) {
    format(
        "inline void $classname$::RegisterArenaDtor(::$proto_ns$::Arena* "
        "arena) {\n"
        "  if (arena != nullptr) {\n"
        "    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n"
        "  }\n"
        "}\n");
  } else {
    format(
        "void $classname$::RegisterArenaDtor(::$proto_ns$::Arena*) {\n"
        "}\n");
  }
}